

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SscWriterGeneric.cpp
# Opt level: O0

void __thiscall
adios2::core::engine::ssc::SscWriterGeneric::SyncWritePattern(SscWriterGeneric *this,bool finalStep)

{
  unsigned_long *puVar1;
  byte in_SIL;
  long in_RDI;
  Buffer globalBuffer;
  Buffer localBuffer;
  Buffer *in_stack_00000a68;
  IO *in_stack_00000a70;
  undefined8 in_stack_fffffffffffffe78;
  undefined4 uVar2;
  size_t capacity;
  int iVar3;
  undefined4 in_stack_fffffffffffffe84;
  int in_stack_fffffffffffffe8c;
  Buffer *in_stack_fffffffffffffe90;
  int local_144;
  allocator *io;
  BlockVecVec *in_stack_fffffffffffffee8;
  Buffer *in_stack_fffffffffffffef0;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::core::StructDefinition,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::core::StructDefinition>_>_>
  *in_stack_ffffffffffffff00;
  Buffer local_d8;
  allocator local_b9;
  string local_b8 [39];
  allocator local_91;
  string local_90 [24];
  string *in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff90;
  int in_stack_ffffffffffffff94;
  undefined6 in_stack_ffffffffffffff98;
  undefined1 in_stack_ffffffffffffff9e;
  undefined1 in_stack_ffffffffffffff9f;
  MPI_Comm in_stack_ffffffffffffffa0;
  Buffer *in_stack_ffffffffffffffa8;
  Buffer *in_stack_ffffffffffffffb0;
  Buffer *in_stack_ffffffffffffffb8;
  unordered_multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::core::StructDefinition,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::core::StructDefinition>_>_>
  *in_stack_ffffffffffffffc0;
  allocator local_31;
  string local_30 [39];
  byte local_9;
  
  uVar2 = (undefined4)((ulong)in_stack_fffffffffffffe78 >> 0x20);
  local_9 = in_SIL & 1;
  io = &local_31;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_30,"Engine",io);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&stack0xffffffffffffff98,"SscWriter",(allocator *)&stack0xffffffffffffff97);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_90,"SyncWritePattern",&local_91);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_b8,"",&local_b9);
  if (*(int *)(in_RDI + 0x78) < 10) {
    local_144 = 0;
  }
  else {
    local_144 = *(int *)(in_RDI + 0x28);
  }
  iVar3 = *(int *)(in_RDI + 0x78);
  capacity = CONCAT44(uVar2,5);
  adios2::helper::Log(local_30,(string *)&stack0xffffffffffffff98,local_90,local_b8,local_144,
                      *(int *)(in_RDI + 0x28),5,iVar3,INFO);
  std::__cxx11::string::~string(local_b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_b9);
  std::__cxx11::string::~string(local_90);
  std::allocator<char>::~allocator((allocator<char> *)&local_91);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff98);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff97);
  std::__cxx11::string::~string(local_30);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  Buffer::Buffer((Buffer *)CONCAT44(in_stack_fffffffffffffe84,iVar3),capacity);
  puVar1 = Buffer::value<unsigned_long>(&local_d8,0);
  *puVar1 = 8;
  if (*(int *)(in_RDI + 0x28) == 0) {
    SerializeStructDefinitions(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  }
  if (*(int *)(in_RDI + 0x28) == *(int *)(in_RDI + 0x2c) + -1) {
    SerializeAttributes(in_stack_00000a70,in_stack_00000a68);
  }
  std::
  vector<std::vector<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>,_std::allocator<std::vector<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>_>_>
  ::operator[]((vector<std::vector<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>,_std::allocator<std::vector<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>_>_>
                *)(in_RDI + 0xd8),(long)*(int *)(in_RDI + 0x20));
  SerializeVariables((BlockVec *)in_stack_ffffffffffffffa0,
                     (Buffer *)
                     CONCAT17(in_stack_ffffffffffffff9f,
                              CONCAT16(in_stack_ffffffffffffff9e,in_stack_ffffffffffffff98)),
                     in_stack_ffffffffffffff94);
  Buffer::Buffer((Buffer *)CONCAT44(in_stack_fffffffffffffe84,iVar3),capacity);
  AggregateMetadata(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,
                    (bool)in_stack_ffffffffffffff9f,(bool)in_stack_ffffffffffffff9e);
  BroadcastMetadata(in_stack_fffffffffffffe90,in_stack_fffffffffffffe8c,
                    (MPI_Comm)CONCAT44(in_stack_fffffffffffffe84,iVar3));
  Deserialize(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,(IO *)io,
              SUB81((ulong)in_RDI >> 0x38,0),SUB81((ulong)in_RDI >> 0x30,0),
              SUB81((ulong)in_RDI >> 0x28,0),in_stack_ffffffffffffff00);
  if ((0x13 < *(int *)(in_RDI + 0x78)) && (*(int *)(in_RDI + 0x28) == 0)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&stack0xfffffffffffffef0,"Global Write Pattern",
               (allocator *)&stack0xfffffffffffffeef);
    PrintBlockVecVec((BlockVecVec *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                     in_stack_ffffffffffffff88);
    std::__cxx11::string::~string((string *)&stack0xfffffffffffffef0);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffeef);
  }
  Buffer::~Buffer((Buffer *)CONCAT44(in_stack_fffffffffffffe84,iVar3));
  Buffer::~Buffer((Buffer *)CONCAT44(in_stack_fffffffffffffe84,iVar3));
  return;
}

Assistant:

void SscWriterGeneric::SyncWritePattern(bool finalStep)
{

    helper::Log("Engine", "SscWriter", "SyncWritePattern", "", m_Verbosity >= 10 ? m_WriterRank : 0,
                m_WriterRank, 5, m_Verbosity, helper::LogMode::INFO);

    ssc::Buffer localBuffer(8);
    localBuffer.value<uint64_t>() = 8;

    if (m_WriterRank == 0)
    {
        ssc::SerializeStructDefinitions(m_IO.m_ADIOS.m_StructDefinitions, localBuffer);
    }

    if (m_WriterRank == m_WriterSize - 1)
    {
        ssc::SerializeAttributes(m_IO, localBuffer);
    }

    ssc::SerializeVariables(m_GlobalWritePattern[m_StreamRank], localBuffer, m_StreamRank);

    ssc::Buffer globalBuffer;

    ssc::AggregateMetadata(localBuffer, globalBuffer, m_WriterComm, finalStep,
                           m_WriterDefinitionsLocked);

    ssc::BroadcastMetadata(globalBuffer, m_WriterMasterStreamRank, m_StreamComm);

    ssc::Deserialize(globalBuffer, m_GlobalWritePattern, m_IO, false, false, false,
                     m_StructDefinitions);

    if (m_Verbosity >= 20 && m_WriterRank == 0)
    {
        ssc::PrintBlockVecVec(m_GlobalWritePattern, "Global Write Pattern");
    }
}